

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

int __thiscall sf::Image::copy(Image *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uchar uVar5;
  uint in_EAX;
  int k_1;
  uint uVar6;
  ulong uVar7;
  void *pvVar8;
  int in_ECX;
  uint uVar9;
  ulong uVar10;
  pointer __dest;
  ulong uVar11;
  int *in_R8;
  char in_R9B;
  long lVar12;
  int iVar13;
  int k;
  uint uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  void *__src;
  
  uVar9 = *(uint *)dst;
  if ((long)(int)uVar9 != 0) {
    uVar6 = *(uint *)(dst + 4);
    in_EAX = (this->m_size).x;
    if ((in_EAX != 0 && uVar6 != 0) && (uVar2 = (this->m_size).y, uVar2 != 0)) {
      uVar14 = in_R8[2];
      uVar3 = in_R8[3];
      iVar13 = 0;
      if (uVar3 == 0 || uVar14 == 0) {
        iVar17 = 0;
        uVar14 = uVar9;
      }
      else {
        iVar13 = *in_R8;
        if (*in_R8 < 1) {
          iVar13 = 0;
        }
        iVar17 = 0;
        if (0 < in_R8[1]) {
          iVar17 = in_R8[1];
        }
        if ((int)uVar9 <= (int)uVar14) {
          uVar14 = uVar9;
        }
        if ((int)uVar3 < (int)uVar6) {
          uVar6 = uVar3;
        }
      }
      iVar4 = (int)src;
      uVar3 = in_EAX - iVar4;
      if (uVar14 + iVar4 <= in_EAX) {
        uVar3 = uVar14;
      }
      uVar14 = uVar2 - in_ECX;
      if (uVar6 + in_ECX <= uVar2) {
        uVar14 = uVar6;
      }
      if ((uVar3 != 0) && (uVar14 != 0)) {
        lVar12 = (long)(int)in_EAX;
        lVar16 = (long)(int)uVar9 * 4;
        __src = (void *)((ulong)((iVar17 * uVar9 + iVar13) * 4) + *(long *)(dst + 8));
        __dest = (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + (in_ECX * in_EAX + iVar4) * 4;
        if (in_R9B == '\0') {
          uVar9 = 0;
          do {
            pvVar8 = memcpy(__dest,__src,(ulong)uVar3 << 2);
            in_EAX = (uint)pvVar8;
            __src = (void *)((long)__src + lVar16);
            __dest = __dest + lVar12 * 4;
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar14);
        }
        else {
          uVar9 = 0;
          do {
            uVar11 = 0;
            do {
              uVar10 = (ulong)(uint)((int)uVar11 * 4);
              bVar1 = *(byte *)((long)__src + uVar10 + 3);
              uVar6 = ((uint)__dest[uVar10 + 3] + (uint)bVar1) -
                      ((uint)__dest[uVar10 + 3] * (uint)bVar1) / 0xff;
              uVar5 = (uchar)uVar6;
              __dest[uVar10 + 3] = uVar5;
              if (uVar5 == '\0') {
                uVar7 = 0;
                do {
                  __dest[uVar7 + uVar10] = *(uchar *)((long)__src + uVar7 + uVar10);
                  uVar7 = uVar7 + 1;
                } while (uVar7 != 3);
              }
              else {
                uVar6 = uVar6 & 0xff;
                lVar15 = 0;
                do {
                  uVar7 = (long)(int)((uint)__dest[lVar15 + uVar10] * (uVar6 - bVar1) +
                                     (uint)*(byte *)((long)__src + lVar15 + uVar10) * (uint)bVar1) /
                          (long)(int)uVar6 & 0xffffffff;
                  __dest[lVar15 + uVar10] = (uchar)uVar7;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
              }
              in_EAX = (uint)uVar7;
              uVar11 = uVar11 + 1;
            } while (uVar11 < uVar3);
            __src = (void *)((long)__src + lVar16);
            __dest = __dest + lVar12 * 4;
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar14);
        }
      }
    }
  }
  return in_EAX;
}

Assistant:

void Image::copy(const Image& source, unsigned int destX, unsigned int destY, const IntRect& sourceRect, bool applyAlpha)
{
    // Make sure that both images are valid
    if ((source.m_size.x == 0) || (source.m_size.y == 0) || (m_size.x == 0) || (m_size.y == 0))
        return;

    // Adjust the source rectangle
    IntRect srcRect = sourceRect;
    if (srcRect.width == 0 || (srcRect.height == 0))
    {
        srcRect.left   = 0;
        srcRect.top    = 0;
        srcRect.width  = static_cast<int>(source.m_size.x);
        srcRect.height = static_cast<int>(source.m_size.y);
    }
    else
    {
        if (srcRect.left   < 0) srcRect.left = 0;
        if (srcRect.top    < 0) srcRect.top  = 0;
        if (srcRect.width  > static_cast<int>(source.m_size.x)) srcRect.width  = static_cast<int>(source.m_size.x);
        if (srcRect.height > static_cast<int>(source.m_size.y)) srcRect.height = static_cast<int>(source.m_size.y);
    }

    // Then find the valid bounds of the destination rectangle
    unsigned int width  = static_cast<unsigned int>(srcRect.width);
    unsigned int height = static_cast<unsigned int>(srcRect.height);
    if (destX + width  > m_size.x) width  = m_size.x - destX;
    if (destY + height > m_size.y) height = m_size.y - destY;

    // Make sure the destination area is valid
    if ((width <= 0) || (height <= 0))
        return;

    // Precompute as much as possible
    std::size_t  pitch     = static_cast<std::size_t>(width) * 4;
    unsigned int rows      = height;
    int          srcStride = static_cast<int>(source.m_size.x) * 4;
    int          dstStride = static_cast<int>(m_size.x) * 4;
    const Uint8* srcPixels = &source.m_pixels[0] + (static_cast<unsigned int>(srcRect.left) + static_cast<unsigned int>(srcRect.top) * source.m_size.x) * 4;
    Uint8*       dstPixels = &m_pixels[0] + (destX + destY * m_size.x) * 4;

    // Copy the pixels
    if (applyAlpha)
    {
        // Interpolation using alpha values, pixel by pixel (slower)
        for (unsigned int i = 0; i < rows; ++i)
        {
            for (unsigned int j = 0; j < width; ++j)
            {
                // Get a direct pointer to the components of the current pixel
                const Uint8* src = srcPixels + j * 4;
                Uint8*       dst = dstPixels + j * 4;

                // Interpolate RGBA components using the alpha values of the destination and source pixels
                Uint8 src_alpha = src[3];
                Uint8 dst_alpha = dst[3];
                Uint8 out_alpha = static_cast<Uint8>(src_alpha + dst_alpha - src_alpha * dst_alpha / 255);

                dst[3] = out_alpha;

                if (out_alpha)
                    for (int k = 0; k < 3; k++)
                        dst[k] = static_cast<Uint8>((src[k] * src_alpha + dst[k] * (out_alpha - src_alpha)) / out_alpha);
                else
                    for (int k = 0; k < 3; k++)
                        dst[k] = src[k];
            }

            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
    else
    {
        // Optimized copy ignoring alpha values, row by row (faster)
        for (unsigned int i = 0; i < rows; ++i)
        {
            std::memcpy(dstPixels, srcPixels, pitch);
            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
}